

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

QLayoutItem * __thiscall QGridLayout::itemAtPosition(QGridLayout *this,int row,int column)

{
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  QLayoutItem *in_RAX;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  uVar5 = (uint)*(undefined8 *)(lVar1 + 0x160);
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0x158) + uVar6 * 8);
      bVar3 = true;
      if (*(int *)(puVar2 + 1) <= row) {
        iVar4 = *(int *)(lVar1 + 0xb0) + -1;
        if (-1 < *(int *)(puVar2 + 2)) {
          iVar4 = *(int *)(puVar2 + 2);
        }
        if ((row <= iVar4) && (*(int *)((long)puVar2 + 0xc) <= column)) {
          iVar4 = *(int *)(lVar1 + 0xb4) + -1;
          if (-1 < *(int *)((long)puVar2 + 0x14)) {
            iVar4 = *(int *)((long)puVar2 + 0x14);
          }
          if (column <= iVar4) {
            in_RAX = (QLayoutItem *)*puVar2;
            bVar3 = false;
          }
        }
      }
      if (!bVar3) {
        return in_RAX;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  return (QLayoutItem *)0x0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }